

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

bool __thiscall
notch::core::EpochCallback::operator()(EpochCallback *this,int currentEpoch,bool alwaysInvoke)

{
  bool bVar1;
  undefined7 in_register_00000011;
  
  if (((int)CONCAT71(in_register_00000011,alwaysInvoke) == 0) &&
     ((this->period < 1 || (currentEpoch % this->period != 0)))) {
    return false;
  }
  bVar1 = std::function<bool_(int)>::operator()(&this->callback,currentEpoch);
  return bVar1;
}

Assistant:

bool operator()(int currentEpoch, bool alwaysInvoke = false) const {
        if (alwaysInvoke || (period > 0 && currentEpoch % period == 0)) {
            return callback(currentEpoch);
        } else {
            return false;
        }
    }